

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    string *filename,LodePNGColorType colortype,uint bitdepth)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  uint *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1152c1);
  local_4 = load_file(in_stack_ffffffffffffffa8,
                      (string *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (local_4 == 0) {
    local_4 = decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_R8D,in_R9D),in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,LCT_GREY,in_stack_ffffffffffffffb0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,1));
  return local_4;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const std::string& filename,
                LodePNGColorType colortype, unsigned bitdepth)
{
  std::vector<unsigned char> buffer;
  unsigned error = load_file(buffer, filename);
  if(error) return error;
  return decode(out, w, h, buffer, colortype, bitdepth);
}